

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_load_image_from_format_to_buffer
          (rf_image *__return_storage_ptr__,void *src,rf_int src_size,int src_width,int src_height,
          rf_uncompressed_pixel_format src_format,void *dst,rf_int dst_size,
          rf_uncompressed_pixel_format dst_format)

{
  ulong uVar1;
  _Bool _Var2;
  _Bool success;
  undefined4 uStack_2c;
  rf_uncompressed_pixel_format src_format_local;
  int src_height_local;
  int src_width_local;
  rf_int src_size_local;
  void *src_local;
  
  memset(__return_storage_ptr__,0,0x18);
  _Var2 = rf_is_uncompressed_format(dst_format);
  if (_Var2) {
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = src_width;
    __return_storage_ptr__->height = src_height;
    uVar1 = CONCAT44(uStack_2c,dst_format) & 0xffffff00ffffffff;
    __return_storage_ptr__->format = (int)uVar1;
    __return_storage_ptr__->valid = (_Bool)(char)(uVar1 >> 0x20);
    *(int3 *)&__return_storage_ptr__->field_0x15 = (int3)(uVar1 >> 0x28);
    rf_format_pixels(src,src_size,src_format,dst,dst_size,dst_format);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_image_from_format_to_buffer(const void* src, rf_int src_size, int src_width, int src_height, rf_uncompressed_pixel_format src_format, void* dst, rf_int dst_size, rf_uncompressed_pixel_format dst_format)
{
    rf_image result = {0};

    if (rf_is_uncompressed_format(dst_format))
    {
        result = (rf_image) {
            .data   = dst,
            .width  = src_width,
            .height = src_height,
            .format = dst_format,
        };

        bool success = rf_format_pixels(src, src_size, src_format, dst, dst_size, dst_format);
        RF_ASSERT(success);
    }

    return result;
}